

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

void __thiscall Image::addChannel(Image *this,string *name,Channel *channel)

{
  int iVar1;
  TypedImageChannel<Imath_3_2::half> *this_00;
  mapped_type *ppIVar2;
  ArgExc *this_01;
  
  iVar1 = *(int *)channel;
  if (iVar1 == 0) {
    this_00 = (TypedImageChannel<Imath_3_2::half> *)operator_new(0x30);
    TypedImageChannel<unsigned_int>::TypedImageChannel
              ((TypedImageChannel<unsigned_int> *)this_00,this,*(int *)(channel + 4),
               *(int *)(channel + 8));
  }
  else if (iVar1 == 2) {
    this_00 = (TypedImageChannel<Imath_3_2::half> *)operator_new(0x30);
    TypedImageChannel<float>::TypedImageChannel
              ((TypedImageChannel<float> *)this_00,this,*(int *)(channel + 4),*(int *)(channel + 8))
    ;
  }
  else {
    if (iVar1 != 1) {
      this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(this_01,"Unknown channel type.");
      __cxa_throw(this_01,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    this_00 = (TypedImageChannel<Imath_3_2::half> *)operator_new(0x30);
    TypedImageChannel<Imath_3_2::half>::TypedImageChannel
              (this_00,this,*(int *)(channel + 4),*(int *)(channel + 8));
  }
  ppIVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageChannel_*>_>_>
            ::operator[](&this->_channels,name);
  *ppIVar2 = &this_00->super_ImageChannel;
  return;
}

Assistant:

void
Image::addChannel (const string& name, const IMF::Channel& channel)
{
    switch (channel.type)
    {
        case IMF::HALF:
            _channels[name] =
                new HalfChannel (*this, channel.xSampling, channel.ySampling);
            break;

        case IMF::FLOAT:
            _channels[name] =
                new FloatChannel (*this, channel.xSampling, channel.ySampling);
            break;

        case IMF::UINT:
            _channels[name] =
                new UIntChannel (*this, channel.xSampling, channel.ySampling);
            break;

        default: throw IEX::ArgExc ("Unknown channel type.");
    }
}